

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O3

int Configtable_insert(config *data)

{
  int iVar1;
  size_t __nmemb;
  s_x4 *psVar2;
  s_x4node *psVar3;
  s_x4node **ppsVar4;
  config *pcVar5;
  config *pcVar6;
  long lVar7;
  uint uVar8;
  int iVar9;
  config *a;
  s_x4node *__ptr;
  s_x4node *psVar10;
  s_x4node *psVar11;
  ulong uVar12;
  
  psVar2 = x4a;
  iVar9 = 0;
  if (x4a != (s_x4 *)0x0) {
    iVar9 = data->rp->index;
    uVar8 = iVar9 * 0x25 + data->dot;
    iVar1 = x4a->size;
    uVar12 = (ulong)(iVar1 - 1U & uVar8);
    psVar11 = (s_x4node *)x4a->ht;
    for (pcVar6 = (&psVar11->data)[uVar12]; pcVar6 != (config *)0x0;
        pcVar6 = *(config **)&pcVar6->dot) {
      if ((((rule *)pcVar6->rp->lhs)->index == iVar9) &&
         (*(int *)&pcVar6->rp->lhsalias == data->dot)) {
        return 0;
      }
    }
    iVar9 = x4a->count;
    if (iVar9 < iVar1) {
      psVar3 = x4a->tbl;
    }
    else {
      __nmemb = (long)iVar1 * 2;
      psVar3 = (s_x4node *)calloc(__nmemb,0x20);
      if (psVar3 == (s_x4node *)0x0) {
        return 0;
      }
      psVar11 = psVar3 + (long)iVar1 * 2;
      iVar1 = (int)__nmemb;
      if (iVar9 < 1) {
        __ptr = psVar2->tbl;
      }
      else {
        __ptr = psVar2->tbl;
        ppsVar4 = &psVar3->next;
        lVar7 = 0;
        do {
          pcVar6 = *(config **)((long)&__ptr->data + lVar7);
          psVar10 = (s_x4node *)
                    (&psVar11->data + (pcVar6->rp->index * 0x25 + pcVar6->dot & iVar1 - 1U));
          if (psVar10->data == (config *)0x0) {
            pcVar5 = (config *)0x0;
          }
          else {
            psVar10->data->fws = (char *)ppsVar4;
            pcVar5 = psVar10->data;
          }
          *ppsVar4 = (s_x4node *)pcVar5;
          ((s_x4node *)(ppsVar4 + -1))->data = pcVar6;
          ppsVar4[1] = psVar10;
          psVar10->data = (config *)(ppsVar4 + -1);
          ppsVar4 = ppsVar4 + 3;
          lVar7 = lVar7 + 0x18;
        } while ((long)iVar9 * 0x18 != lVar7);
      }
      free(__ptr);
      psVar2->size = iVar1;
      psVar2->tbl = psVar3;
      psVar2->ht = (s_x4node **)psVar11;
      uVar12 = (ulong)(iVar1 - 1U & uVar8);
    }
    psVar2->count = iVar9 + 1;
    pcVar6 = (config *)(psVar3 + iVar9);
    pcVar6->rp = (rule *)data;
    if ((&psVar11->data)[uVar12] == (config *)0x0) {
      pcVar5 = (config *)0x0;
    }
    else {
      (&psVar11->data)[uVar12]->fws = (char *)&pcVar6->dot;
      pcVar5 = (&psVar11->data)[uVar12];
    }
    *(config **)&pcVar6->dot = pcVar5;
    (&psVar11->data)[uVar12] = pcVar6;
    pcVar6->fws = (char *)(psVar2->ht + uVar12);
    iVar9 = 1;
  }
  return iVar9;
}

Assistant:

int Configtable_insert(struct config *data)
{
  x4node *np;
  unsigned h;
  unsigned ph;

  if( x4a==0 ) return 0;
  ph = confighash(data);
  h = ph & (x4a->size-1);
  np = x4a->ht[h];
  while( np ){
    if( Configcmp((const char *) np->data,(const char *) data)==0 ){
      /* An existing entry with the same key is found. */
      /* Fail because overwrite is not allows. */
      return 0;
    }
    np = np->next;
  }
  if( x4a->count>=x4a->size ){
    /* Need to make the hash table bigger */
    int i,size;
    struct s_x4 array;
    array.size = size = x4a->size*2;
    array.count = x4a->count;
    array.tbl = (x4node*)calloc(size, sizeof(x4node) + sizeof(x4node*));
    if( array.tbl==0 ) return 0;  /* Fail due to malloc failure */
    array.ht = (x4node**)&(array.tbl[size]);
    for(i=0; i<size; i++) array.ht[i] = 0;
    for(i=0; i<x4a->count; i++){
      x4node *oldnp, *newnp;
      oldnp = &(x4a->tbl[i]);
      h = confighash(oldnp->data) & (size-1);
      newnp = &(array.tbl[i]);
      if( array.ht[h] ) array.ht[h]->from = &(newnp->next);
      newnp->next = array.ht[h];
      newnp->data = oldnp->data;
      newnp->from = &(array.ht[h]);
      array.ht[h] = newnp;
    }
    free(x4a->tbl);
    *x4a = array;
  }
  /* Insert the new data */
  h = ph & (x4a->size-1);
  np = &(x4a->tbl[x4a->count++]);
  np->data = data;
  if( x4a->ht[h] ) x4a->ht[h]->from = &(np->next);
  np->next = x4a->ht[h];
  x4a->ht[h] = np;
  np->from = &(x4a->ht[h]);
  return 1;
}